

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::OneofDescriptorProto::Clear(OneofDescriptorProto *this)

{
  uint uVar1;
  string *psVar2;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar2 = (this->name_).ptr_;
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    if ((uVar1 & 2) != 0) {
      OneofOptions::Clear(this->options_);
    }
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void OneofDescriptorProto::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.OneofDescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      name_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000002u) {
      GOOGLE_DCHECK(options_ != nullptr);
      options_->Clear();
    }
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}